

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupPermFlop(Gia_Man_t *p,Vec_Int_t *vFfPerm)

{
  uint uVar1;
  int iVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pObj;
  int iVar5;
  
  if (vFfPerm->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vFfPerm) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x35e,"Gia_Man_t *Gia_ManDupPermFlop(Gia_Man_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < p->vCis->nSize - p->nRegs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar1;
  }
  for (iVar5 = 0; iVar5 < p->nRegs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    iVar2 = Vec_IntEntry(vFfPerm,iVar5);
    pGVar4 = Gia_ManRo(p,iVar2);
    pGVar4->Value = uVar1;
  }
  for (iVar5 = 0; iVar5 < p->nObjs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManObj(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      iVar2 = Gia_ObjFanin0Copy(pGVar4);
      iLit1 = Gia_ObjFanin1Copy(pGVar4);
      uVar1 = Gia_ManAppendAnd(p_00,iVar2,iLit1);
      pGVar4->Value = uVar1;
    }
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize - p->nRegs; iVar5 = iVar5 + 1) {
    pGVar4 = Gia_ManCo(p,iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar4);
    uVar1 = Gia_ManAppendCo(p_00,iVar2);
    pGVar4->Value = uVar1;
  }
  iVar5 = 0;
  do {
    iVar2 = p->nRegs;
    if (iVar2 <= iVar5) {
LAB_001d4797:
      Gia_ManSetRegNum(p_00,iVar2);
      return p_00;
    }
    pGVar4 = Gia_ManCo(p,(p->vCos->nSize - iVar2) + iVar5);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar2 = p->nRegs;
      goto LAB_001d4797;
    }
    iVar2 = Vec_IntEntry(vFfPerm,iVar5);
    pObj = Gia_ManRi(p,iVar2);
    iVar2 = Gia_ObjFanin0Copy(pObj);
    uVar1 = Gia_ManAppendCo(p_00,iVar2);
    pGVar4->Value = uVar1;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManDupPermFlop( Gia_Man_t * p, Vec_Int_t * vFfPerm )
{
    //Vec_Int_t * vPermInv;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Vec_IntSize(vFfPerm) == Gia_ManRegNum(p) );
    //vPermInv = Vec_IntInvert( vFfPerm, -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        //Gia_ManRo(p, Vec_IntEntry(vPermInv, i))->Value = Gia_ManAppendCi(pNew);
        Gia_ManRo(p, Vec_IntEntry(vFfPerm, i))->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachRi( p, pObj, i )
        //pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vPermInv, i)) ) );
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy( Gia_ManRi(p, Vec_IntEntry(vFfPerm, i)) ) );
    //Vec_IntFree( vPermInv );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}